

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_connection *
mg_connect_websocket_client
          (char *host,int port,int use_ssl,char *error_buffer,size_t error_buffer_size,char *path,
          char *origin,mg_websocket_data_handler data_func,mg_websocket_close_handler close_func,
          void *user_data)

{
  mg_connection *pmVar1;
  undefined1 local_60 [8];
  mg_client_options client_options;
  char *path_local;
  size_t error_buffer_size_local;
  char *error_buffer_local;
  int use_ssl_local;
  int port_local;
  char *host_local;
  
  client_options.host_name = path;
  memset(local_60,0,0x28);
  local_60 = (undefined1  [8])host;
  client_options.host._0_4_ = port;
  pmVar1 = mg_connect_websocket_client_impl
                     ((mg_client_options *)local_60,use_ssl,error_buffer,error_buffer_size,
                      client_options.host_name,origin,(char *)0x0,data_func,close_func,user_data);
  return pmVar1;
}

Assistant:

mg_connection *
mg_connect_websocket_client(const char *host,
                            int port,
                            int use_ssl,
                            char *error_buffer,
                            size_t error_buffer_size,
                            const char *path,
                            const char *origin,
                            mg_websocket_data_handler data_func,
                            mg_websocket_close_handler close_func,
                            void *user_data)
{
	struct mg_client_options client_options;
	memset(&client_options, 0, sizeof(client_options));
	client_options.host = host;
	client_options.port = port;

	return mg_connect_websocket_client_impl(&client_options,
	                                        use_ssl,
	                                        error_buffer,
	                                        error_buffer_size,
	                                        path,
	                                        origin,
	                                        NULL,
	                                        data_func,
	                                        close_func,
	                                        user_data);
}